

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_e88282::Target::Dump(Value *__return_storage_ptr__,Target *this)

{
  _Link_type __k;
  size_t *psVar1;
  pointer *ppSVar2;
  pointer *ppCVar3;
  uint uVar4;
  UInt value;
  cmMakefile *pcVar5;
  pointer pcVar6;
  pointer __first;
  cmSourceFile *this_00;
  cmGeneratorTarget *headTarget;
  _Base_ptr p_Var7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar9;
  pointer pSVar10;
  pointer pCVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ValueHolder *pVVar14;
  _Rb_tree_node_base *p_Var15;
  bool bVar16;
  TargetType targetType;
  TargetType TVar17;
  int iVar18;
  ArrayIndex AVar19;
  string *psVar20;
  Value *pVVar21;
  char *pcVar22;
  cmLocalGenerator *pcVar23;
  string *psVar24;
  cmInstallTargetGenerator *this_01;
  cmGlobalGenerator *pcVar25;
  OutputInfo *pOVar26;
  undefined8 *puVar27;
  Value *pVVar28;
  size_t sVar29;
  TargetDependSet *pTVar30;
  _Base_ptr p_Var31;
  iterator iVar32;
  _Rb_tree_node_base *this_02;
  _Rb_tree_node_base *p_Var33;
  iterator iVar34;
  byte extraout_var;
  pointer __result;
  pointer pIVar35;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar36;
  KindedSources *pKVar37;
  _Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false> _Var38;
  pointer pSVar39;
  ValueHolder *pVVar40;
  long lVar41;
  ulong uVar42;
  ValueHolder *pVVar43;
  long *plVar44;
  pointer pCVar45;
  Value *extraout_RAX;
  _Tp_alloc_type *__alloc;
  long lVar46;
  size_type *psVar47;
  string *path_00;
  string *path_01;
  SourceGroup *__args;
  SourceGroup *extraout_RDX;
  SourceGroup *__args_00;
  bool *pbVar48;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  _Rb_tree_header *p_Var49;
  ValueHolder VVar50;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__v;
  undefined8 uVar51;
  pointer pSVar52;
  pointer pSVar53;
  _Link_type __p;
  ValueHolder VVar54;
  ValueHolder *pVVar55;
  undefined8 uVar56;
  pointer pSVar57;
  _Base_ptr p_Var58;
  pointer pSVar59;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar60;
  pointer pSVar61;
  _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  *p_Var62;
  ValueHolder *pVVar63;
  ulong uVar64;
  ulong uVar65;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar66;
  pair<std::__detail::_Node_iterator<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false,_false>,_bool>
  pVar67;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value,_unsigned_int>_>,_bool> pVar68;
  string obj_dir;
  size_type __dnew;
  Value artifact;
  string p;
  Value artifacts;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> installGens;
  __string_type __str;
  string COMPILE_DEFINITIONS;
  Value compileDataJson;
  string defPropName;
  string path;
  Value dependencies;
  ValueHolder local_698;
  ValueHolder VStack_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  ValueHolder *local_678;
  undefined8 local_670;
  Value *local_660;
  ValueHolder local_658;
  string *psStack_650;
  string local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_628;
  ValueHolder local_620;
  ValueHolder local_618;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_610;
  ValueHolder local_600;
  long local_5f8;
  undefined1 local_5f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  undefined8 local_5d0;
  string *psStack_5c8;
  string *local_5c0;
  undefined8 uStack_5b8;
  ValueHolder *local_5b0;
  ValueHolder *pVStack_5a8;
  ValueHolder *local_5a0;
  ValueHolder local_598;
  undefined1 local_590 [8];
  undefined1 local_588 [24];
  ptrdiff_t local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  ValueHolder local_530 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  ValueHolder local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  ValueHolder local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  pointer local_490;
  _Base_ptr local_488;
  ValueHolder local_480;
  ValueHolder local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  ValueHolder local_460;
  pointer local_458;
  _Rb_tree_node_base *local_450;
  ValueHolder local_448;
  long local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  string local_420;
  _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  *local_400;
  _Rb_tree<Json::Value,std::pair<Json::Value_const,unsigned_int>,std::_Select1st<std::pair<Json::Value_const,unsigned_int>>,std::less<Json::Value>,std::allocator<std::pair<Json::Value_const,unsigned_int>>>
  *local_3f8;
  _Hashtable<const_cmSourceGroup_*,_std::pair<const_cmSourceGroup_*const,_unsigned_int>,_std::allocator<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmSourceGroup_*>,_std::hash<const_cmSourceGroup_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  _Base_ptr local_3c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
  *local_3c0;
  _Base_ptr local_3b8;
  string *local_3b0;
  _Alloc_node local_3a8;
  Value local_3a0;
  Value local_378;
  Value local_350;
  Value local_328;
  Value local_300;
  Value local_2d8;
  Value local_2b0;
  Value local_288;
  Value local_260;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  local_660 = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  targetType = cmGeneratorTarget::GetType(this->GT);
  psVar20 = cmGeneratorTarget::GetName_abi_cxx11_(this->GT);
  Json::Value::Value(&local_d0,psVar20);
  pVVar21 = Json::Value::operator[](local_660,"name");
  Json::Value::operator=(pVVar21,&local_d0);
  Json::Value::~Value(&local_d0);
  pcVar22 = cmState::GetTargetTypeName(targetType);
  Json::Value::Value(&local_f8,pcVar22);
  pVVar21 = Json::Value::operator[](local_660,"type");
  Json::Value::operator=(pVVar21,&local_f8);
  Json::Value::~Value(&local_f8);
  psVar20 = &this->TopBuild;
  TargetId((string *)&local_620,this->GT,psVar20);
  Json::Value::Value(&local_120,(string *)&local_620);
  pVVar21 = Json::Value::operator[](local_660,"id");
  Json::Value::operator=(pVVar21,&local_120);
  Json::Value::~Value(&local_120);
  if (local_620 != &local_610) {
    operator_delete(local_620.string_,
                    CONCAT17(local_610._M_local_buf[7],
                             CONCAT16(local_610._M_local_buf[6],
                                      CONCAT15(local_610._M_local_buf[5],
                                               CONCAT14(local_610._M_local_buf[4],
                                                        local_610._M_allocated_capacity._0_4_)))) +
                    1);
  }
  Json::Value::Value(&local_2d8,objectValue);
  pcVar23 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  psVar24 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar23);
  local_3b0 = &this->TopSource;
  RelativeIfUnder((string *)&local_598,local_3b0,psVar24);
  Json::Value::Value((Value *)&local_620,(string *)&local_598);
  pVVar21 = Json::Value::operator[](&local_2d8,"source");
  Json::Value::operator=(pVVar21,(Value *)&local_620);
  Json::Value::~Value((Value *)&local_620);
  if (local_598 != (cmSourceGroup *)(local_590 + 8)) {
    operator_delete(local_598.string_,CONCAT35(local_588._5_3_,local_588._0_5_) + 1);
  }
  psVar24 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar23);
  RelativeIfUnder((string *)&local_698,psVar20,psVar24);
  Json::Value::Value((Value *)&local_598,(string *)&local_698);
  pVVar21 = Json::Value::operator[](&local_2d8,"build");
  Json::Value::operator=(pVVar21,(Value *)&local_598);
  Json::Value::~Value((Value *)&local_598);
  if (local_698 != &local_688) {
    operator_delete(local_698.string_,(ulong)(local_688._M_allocated_capacity + 1));
  }
  pVVar21 = Json::Value::operator[](local_660,"paths");
  Json::Value::operator=(pVVar21,&local_2d8);
  Json::Value::~Value(&local_2d8);
  bVar16 = cmTarget::GetIsGeneratorProvided(this->GT->Target);
  if (bVar16) {
    Json::Value::Value(&local_148,true);
    pVVar21 = Json::Value::operator[](local_660,"isGeneratorProvided");
    Json::Value::operator=(pVVar21,&local_148);
    Json::Value::~Value(&local_148);
  }
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&local_620);
  AddBacktrace(this,local_660,(cmListFileBacktrace *)&local_620);
  if (local_618 != (string *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618.map_);
  }
  bVar16 = cmTarget::GetHaveInstallRule(this->GT->Target);
  if (bVar16) {
    Json::Value::Value(&local_300,objectValue);
    Json::Value::Value((Value *)&local_698,objectValue);
    pcVar5 = this->GT->Makefile;
    local_620.string_ = (char *)&local_610;
    local_658.int_ = 0x14;
    local_620.int_ = std::__cxx11::string::_M_create(&local_620.uint_,(ulong)&local_658);
    local_610._M_allocated_capacity._0_4_ = (undefined4)local_658.int_;
    local_610._M_local_buf[4] = (char)((ulong)local_658 >> 0x20);
    local_610._M_local_buf[5] = (char)((ulong)local_658 >> 0x28);
    local_610._M_local_buf[6] = (char)((ulong)local_658 >> 0x30);
    local_610._M_local_buf[7] = (char)((ulong)local_658 >> 0x38);
    builtin_strncpy((char *)local_620,"CMAKE_IN",8);
    builtin_strncpy((char *)((long)&(local_620.map_)->_M_t + 8),"STALL_PR",8);
    *(undefined4 *)
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&(local_620.map_)->_M_t + 1) = 0x58494645;
    local_618.int_ = local_658.int_;
    local_620.string_[local_658.string_] = '\0';
    psVar24 = cmMakefile::GetSafeDefinition(pcVar5,(string *)&local_620);
    local_598.string_ = local_590 + 8;
    pcVar6 = (psVar24->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_598,pcVar6,pcVar6 + psVar24->_M_string_length);
    if (local_620 != &local_610) {
      operator_delete(local_620.string_,
                      CONCAT17(local_610._M_local_buf[7],
                               CONCAT16(local_610._M_local_buf[6],
                                        CONCAT15(local_610._M_local_buf[5],
                                                 CONCAT14(local_610._M_local_buf[4],
                                                          local_610._M_allocated_capacity._0_4_))))
                      + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_598);
    Json::Value::Value((Value *)&local_620,(string *)&local_598);
    pVVar21 = Json::Value::operator[]((Value *)&local_698,"path");
    Json::Value::operator=(pVVar21,(Value *)&local_620);
    Json::Value::~Value((Value *)&local_620);
    if (local_598 != (cmSourceGroup *)(local_590 + 8)) {
      operator_delete(local_598.string_,CONCAT35(local_588._5_3_,local_588._0_5_) + 1);
    }
    pVVar21 = Json::Value::operator[](&local_300,"prefix");
    Json::Value::operator=(pVVar21,(Value *)&local_698);
    Json::Value::~Value((Value *)&local_698);
    Json::Value::Value((Value *)&local_658,arrayValue);
    std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::vector
              ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)&local_4e0,
               &this->GT->Makefile->InstallGenerators);
    if (local_4e0 != local_4d8) {
      VVar50 = local_4e0;
      do {
        if (((*(size_type *)VVar50.string_ != 0) &&
            (this_01 = (cmInstallTargetGenerator *)
                       __dynamic_cast(*(size_type *)VVar50.string_,&cmInstallGenerator::typeinfo,
                                      &cmInstallTargetGenerator::typeinfo),
            this_01 != (cmInstallTargetGenerator *)0x0)) && (this_01->Target == this->GT)) {
          Json::Value::Value((Value *)&local_598,objectValue);
          cmInstallTargetGenerator::GetDestination((string *)local_530,this_01,this->Config);
          Json::Value::Value((Value *)&local_620,(string *)local_530);
          pVVar21 = Json::Value::operator[]((Value *)&local_598,"path");
          Json::Value::operator=(pVVar21,(Value *)&local_620);
          Json::Value::~Value((Value *)&local_620);
          if (local_530[0] != &local_520) {
            operator_delete(local_530[0].string_,local_520._M_allocated_capacity + 1);
          }
          AddBacktrace(this,(Value *)&local_598,&this_01->Backtrace);
          Json::Value::append((Value *)&local_658,(Value *)&local_598);
          Json::Value::~Value((Value *)&local_598);
        }
        VVar50.string_ = (char *)((long)&(VVar50.map_)->_M_t + 8);
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)VVar50.int_ != local_4d8);
    }
    if (local_4e0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_4e0.string_,local_4d0._M_allocated_capacity - (long)local_4e0);
    }
    pVVar21 = Json::Value::operator[](&local_300,"destinations");
    Json::Value::operator=(pVVar21,(Value *)&local_658);
    Json::Value::~Value((Value *)&local_658);
    pVVar21 = Json::Value::operator[](local_660,"install");
    Json::Value::operator=(pVVar21,&local_300);
    Json::Value::~Value(&local_300);
  }
  bVar16 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar16) {
    Json::Value::Value((Value *)local_530,arrayValue);
    TVar17 = cmGeneratorTarget::GetType(this->GT);
    if (TVar17 == OBJECT_LIBRARY) {
      pcVar25 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
      iVar18 = (*pcVar25->_vptr_cmGlobalGenerator[0x25])(pcVar25,0);
      if ((char)iVar18 != '\0') {
        local_508.int_ = 0;
        paStack_500 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_4f8._M_allocated_capacity._0_5_ = 0;
        local_4f8._M_allocated_capacity._5_3_ = 0;
        cmGeneratorTarget::GetObjectSources
                  (this->GT,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                            &local_508,this->Config);
        cmGeneratorTarget::GetObjectDirectory((string *)&local_698,this->GT,this->Config);
        paVar36 = paStack_500;
        if (local_508 != paStack_500) {
          VVar50 = local_508;
          do {
            psVar24 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                                (this->GT,*(cmSourceFile **)VVar50.string_);
            Json::Value::Value((Value *)&local_620,objectValue);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_4e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_698,psVar24);
            RelativeIfUnder((string *)&local_658,psVar20,(string *)&local_4e0);
            Json::Value::Value((Value *)&local_598,(string *)&local_658);
            pVVar21 = Json::Value::operator[]((Value *)&local_620,"path");
            Json::Value::operator=(pVVar21,(Value *)&local_598);
            Json::Value::~Value((Value *)&local_598);
            if (local_658 != &local_648) {
              operator_delete(local_658.string_,(ulong)(local_648._M_dataplus._M_p + 1));
            }
            if (local_4e0 != &local_4d0) {
              operator_delete(local_4e0.string_,local_4d0._M_allocated_capacity + 1);
            }
            Json::Value::append((Value *)local_530,(Value *)&local_620);
            Json::Value::~Value((Value *)&local_620);
            VVar50.string_ = (char *)((long)&(VVar50.map_)->_M_t + 8);
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)VVar50.int_ != paVar36);
        }
        if (local_698 != &local_688) {
          operator_delete(local_698.string_,(ulong)(local_688._M_allocated_capacity + 1));
        }
        if (local_508 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_508.string_,
                          CONCAT35(local_4f8._M_allocated_capacity._5_3_,
                                   local_4f8._M_allocated_capacity._0_5_) - (long)local_508);
        }
      }
    }
    else {
      Json::Value::Value((Value *)&local_620,objectValue);
      cmGeneratorTarget::GetFullPath
                ((string *)&local_658,this->GT,this->Config,RuntimeBinaryArtifact,false);
      RelativeIfUnder((string *)&local_698,psVar20,(string *)&local_658);
      Json::Value::Value((Value *)&local_598,(string *)&local_698);
      pVVar21 = Json::Value::operator[]((Value *)&local_620,"path");
      Json::Value::operator=(pVVar21,(Value *)&local_598);
      Json::Value::~Value((Value *)&local_598);
      if (local_698 != &local_688) {
        operator_delete(local_698.string_,(ulong)(local_688._M_allocated_capacity + 1));
      }
      if (local_658 != &local_648) {
        operator_delete(local_658.string_,(ulong)(local_648._M_dataplus._M_p + 1));
      }
      Json::Value::append((Value *)local_530,(Value *)&local_620);
      Json::Value::~Value((Value *)&local_620);
      bVar16 = cmGeneratorTarget::IsDLLPlatform(this->GT);
      if ((bVar16) && (TVar17 = cmGeneratorTarget::GetType(this->GT), TVar17 != STATIC_LIBRARY)) {
        TVar17 = cmGeneratorTarget::GetType(this->GT);
        if ((TVar17 == SHARED_LIBRARY) ||
           (bVar16 = cmGeneratorTarget::IsExecutableWithExports(this->GT), bVar16)) {
          Json::Value::Value((Value *)&local_620,objectValue);
          cmGeneratorTarget::GetFullPath
                    ((string *)&local_4e0,this->GT,this->Config,ImportLibraryArtifact,false);
          RelativeIfUnder((string *)&local_658,psVar20,(string *)&local_4e0);
          Json::Value::Value((Value *)&local_698,(string *)&local_658);
          pVVar21 = Json::Value::operator[]((Value *)&local_620,"path");
          Json::Value::operator=(pVVar21,(Value *)&local_698);
          Json::Value::~Value((Value *)&local_698);
          if (local_658 != &local_648) {
            operator_delete(local_658.string_,(ulong)(local_648._M_dataplus._M_p + 1));
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0.string_,local_4d0._M_allocated_capacity + 1);
          }
          Json::Value::append((Value *)local_530,(Value *)&local_620);
          Json::Value::~Value((Value *)&local_620);
        }
        pOVar26 = cmGeneratorTarget::GetOutputInfo(this->GT,this->Config);
        if ((pOVar26 != (OutputInfo *)0x0) && ((pOVar26->PdbDir)._M_string_length != 0)) {
          Json::Value::Value((Value *)&local_620,objectValue);
          pcVar6 = (pOVar26->PdbDir)._M_dataplus._M_p;
          local_4b8._M_allocated_capacity = (size_type)&local_4a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4b8,pcVar6,pcVar6 + (pOVar26->PdbDir)._M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_4b8,local_4b8._8_8_,0,'\x01');
          cmGeneratorTarget::GetPDBName((string *)&local_448,this->GT,this->Config);
          uVar64 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_allocated_capacity != &local_4a8) {
            uVar64 = CONCAT17(local_4a8._M_local_buf[7],local_4a8._M_allocated_capacity._0_7_);
          }
          if (uVar64 < (ulong)(local_440 + local_4b8._8_8_)) {
            uVar56 = 0xf;
            if (local_448 != &local_438) {
              uVar56 = local_438._M_allocated_capacity;
            }
            if ((ulong)uVar56 < (ulong)(local_440 + local_4b8._8_8_)) goto LAB_002e0563;
            puVar27 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_448,0,(char *)0x0,local_4b8._M_allocated_capacity);
          }
          else {
LAB_002e0563:
            puVar27 = (undefined8 *)
                      std::__cxx11::string::_M_append(local_4b8._M_local_buf,local_448.uint_);
          }
          local_508.string_ = (char *)&local_4f8;
          paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar27 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 == paVar36) {
            uVar56 = puVar27[3];
            local_4f8._M_allocated_capacity._0_5_ = (undefined5)paVar36->_M_allocated_capacity;
            local_4f8._M_allocated_capacity._5_3_ =
                 (undefined3)(paVar36->_M_allocated_capacity >> 0x28);
            local_4f8._8_5_ = (undefined5)uVar56;
            local_4f8._M_local_buf[0xd] = (char)((ulong)uVar56 >> 0x28);
            local_4f8._14_2_ = (undefined2)((ulong)uVar56 >> 0x30);
          }
          else {
            local_4f8._M_allocated_capacity._0_5_ = (undefined5)paVar36->_M_allocated_capacity;
            local_4f8._M_allocated_capacity._5_3_ =
                 (undefined3)(paVar36->_M_allocated_capacity >> 0x28);
            local_508.string_ = ((char *)*puVar27).string_;
          }
          paStack_500 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar27[1];
          *puVar27 = paVar36;
          puVar27[1] = 0;
          paVar36->_M_local_buf[0] = '\0';
          RelativeIfUnder((string *)&local_4e0,psVar20,(string *)&local_508);
          Json::Value::Value((Value *)&local_658,(string *)&local_4e0);
          pVVar21 = Json::Value::operator[]((Value *)&local_620,"path");
          Json::Value::operator=(pVVar21,(Value *)&local_658);
          Json::Value::~Value((Value *)&local_658);
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0.string_,local_4d0._M_allocated_capacity + 1);
          }
          if (local_508 != &local_4f8) {
            operator_delete(local_508.string_,
                            CONCAT35(local_4f8._M_allocated_capacity._5_3_,
                                     local_4f8._M_allocated_capacity._0_5_) + 1);
          }
          if (local_448 != &local_438) {
            operator_delete(local_448.string_,local_438._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_allocated_capacity != &local_4a8) {
            operator_delete((void *)local_4b8._M_allocated_capacity,
                            CONCAT17(local_4a8._M_local_buf[7],local_4a8._M_allocated_capacity._0_7_
                                    ) + 1);
          }
          Json::Value::append((Value *)local_530,(Value *)&local_620);
          Json::Value::~Value((Value *)&local_620);
        }
      }
    }
    bVar16 = Json::Value::empty((Value *)local_530);
    if (!bVar16) {
      Json::Value::Value(&local_170,(Value *)local_530);
      pVVar21 = Json::Value::operator[](local_660,"artifacts");
      Json::Value::operator=(pVVar21,&local_170);
      Json::Value::~Value(&local_170);
    }
    Json::Value::~Value((Value *)local_530);
  }
  if (targetType - SHARED_LIBRARY < 2) {
LAB_002e074c:
    cmGeneratorTarget::GetFullName((string *)&local_620,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value(&local_198,(string *)&local_620);
    pVVar21 = Json::Value::operator[](local_660,"nameOnDisk");
    Json::Value::operator=(pVVar21,&local_198);
    Json::Value::~Value(&local_198);
    if (local_620 != &local_610) {
      operator_delete(local_620.string_,
                      CONCAT17(local_610._M_local_buf[7],
                               CONCAT16(local_610._M_local_buf[6],
                                        CONCAT15(local_610._M_local_buf[5],
                                                 CONCAT14(local_610._M_local_buf[4],
                                                          local_610._M_allocated_capacity._0_4_))))
                      + 1);
    }
    Json::Value::Value(&local_378,objectValue);
    cmGeneratorTarget::GetLinkerLanguage((string *)local_530,this->GT,this->Config);
    Json::Value::Value((Value *)&local_620,(string *)local_530);
    pVVar21 = &local_378;
    pVVar28 = Json::Value::operator[](pVVar21,"language");
    Json::Value::operator=(pVVar28,(Value *)&local_620);
    Json::Value::~Value((Value *)&local_620);
    DumpLinkCommandFragments((Value *)&local_598,this);
    bVar16 = Json::Value::empty((Value *)&local_598);
    if (!bVar16) {
      Json::Value::Value((Value *)&local_698,(Value *)&local_598);
      pVVar28 = Json::Value::operator[](&local_378,"commandFragments");
      Json::Value::operator=(pVVar28,(Value *)&local_698);
      Json::Value::~Value((Value *)&local_698);
    }
    Json::Value::~Value((Value *)&local_598);
    pcVar5 = this->GT->Makefile;
    local_598.string_ = local_590 + 8;
    local_658.int_ = 0x12;
    local_598.int_ = std::__cxx11::string::_M_create(&local_598.uint_,(ulong)&local_658);
    local_588._0_5_ = (undefined5)local_658.int_;
    local_588._5_3_ = (undefined3)((ulong)local_658 >> 0x28);
    builtin_strncpy((char *)local_598,"CMAKE_SY",8);
    *(undefined8 *)&((local_598.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
         0x494c5f544f4f5253;
    *(undefined2 *)&((local_598.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         0x4b4e;
    local_590 = (undefined1  [8])local_658;
    local_598.string_[local_658.string_] = '\0';
    pcVar22 = cmMakefile::GetDefinition(pcVar5,(string *)&local_598);
    if (local_598 != (cmSourceGroup *)(local_590 + 8)) {
      operator_delete(local_598.string_,CONCAT35(local_588._5_3_,local_588._0_5_) + 1);
    }
    if (pcVar22 == (char *)0x0) {
      local_588._0_5_ = 0x454b414d43;
      local_588._5_3_ = 0x59535f;
      local_588._8_5_ = 0x544f4f5253;
      local_590 = (undefined1  [8])0xd;
      local_588[0xd] = 0;
      local_598.string_ = local_590 + 8;
      pcVar22 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&local_598);
      if (local_598 != local_590 + 8) {
        operator_delete(local_598.string_,CONCAT35(local_588._5_3_,local_588._0_5_) + 1);
      }
      if (pcVar22 != (char *)0x0) {
        local_658.string_ = (char *)&local_648;
        sVar29 = strlen(pcVar22);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_658,pcVar22,pcVar22 + sVar29);
        DumpSysroot((Value *)&local_598,(Target *)&local_658,path_01);
        pVVar28 = Json::Value::operator[](&local_378,"sysroot");
        Json::Value::operator=(pVVar28,(Value *)&local_598);
        goto LAB_002e0a73;
      }
    }
    else {
      local_658.string_ = (char *)&local_648;
      sVar29 = strlen(pcVar22);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,pcVar22,pcVar22 + sVar29)
      ;
      DumpSysroot((Value *)&local_598,(Target *)&local_658,path_00);
      pVVar28 = Json::Value::operator[](&local_378,"sysroot");
      Json::Value::operator=(pVVar28,(Value *)&local_598);
LAB_002e0a73:
      Json::Value::~Value((Value *)&local_598);
      if (local_658 != &local_648) {
        operator_delete(local_658.string_,(ulong)(local_648._M_dataplus._M_p + 1));
      }
    }
    bVar16 = cmGeneratorTarget::IsIPOEnabled(this->GT,(string *)local_530,this->Config);
    if (bVar16) {
      Json::Value::Value((Value *)&local_658,true);
      pVVar28 = Json::Value::operator[](&local_378,"lto");
      Json::Value::operator=(pVVar28,(Value *)&local_658);
      Json::Value::~Value((Value *)&local_658);
    }
    if (local_530[0] != &local_520) {
      operator_delete(local_530[0].string_,local_520._M_allocated_capacity + 1);
    }
    pVVar28 = Json::Value::operator[](local_660,"link");
    Json::Value::operator=(pVVar28,pVVar21);
  }
  else {
    if (targetType != STATIC_LIBRARY) {
      if (targetType != EXECUTABLE) goto LAB_002e0ce7;
      goto LAB_002e074c;
    }
    cmGeneratorTarget::GetFullName((string *)&local_620,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value(&local_1c0,(string *)&local_620);
    pVVar21 = Json::Value::operator[](local_660,"nameOnDisk");
    Json::Value::operator=(pVVar21,&local_1c0);
    Json::Value::~Value(&local_1c0);
    if (local_620 != &local_610) {
      operator_delete(local_620.string_,
                      CONCAT17(local_610._M_local_buf[7],
                               CONCAT16(local_610._M_local_buf[6],
                                        CONCAT15(local_610._M_local_buf[5],
                                                 CONCAT14(local_610._M_local_buf[4],
                                                          local_610._M_allocated_capacity._0_4_))))
                      + 1);
    }
    pVVar21 = &local_288;
    Json::Value::Value(pVVar21,objectValue);
    DumpLinkCommandFragments((Value *)&local_620,this);
    bVar16 = Json::Value::empty((Value *)&local_620);
    if (!bVar16) {
      Json::Value::Value((Value *)&local_598,(Value *)&local_620);
      pVVar28 = Json::Value::operator[](&local_288,"commandFragments");
      Json::Value::operator=(pVVar28,(Value *)&local_598);
      Json::Value::~Value((Value *)&local_598);
    }
    Json::Value::~Value((Value *)&local_620);
    cmGeneratorTarget::GetLinkerLanguage((string *)&local_698,this->GT,this->Config);
    bVar16 = cmGeneratorTarget::IsIPOEnabled(this->GT,(string *)&local_698,this->Config);
    if (bVar16) {
      Json::Value::Value((Value *)&local_620,true);
      pVVar28 = Json::Value::operator[](&local_288,"lto");
      Json::Value::operator=(pVVar28,(Value *)&local_620);
      Json::Value::~Value((Value *)&local_620);
    }
    if (local_698 != &local_688) {
      operator_delete(local_698.string_,(ulong)(local_688._M_allocated_capacity + 1));
    }
    pVVar28 = Json::Value::operator[](local_660,"archive");
    Json::Value::operator=(pVVar28,pVVar21);
  }
  Json::Value::~Value(pVVar21);
LAB_002e0ce7:
  Json::Value::Value(&local_328,arrayValue);
  pcVar25 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  pTVar30 = cmGlobalGenerator::GetTargetDirectDepends(pcVar25,this->GT);
  p_Var31 = (pTVar30->
            super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
            _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var49 = &(pTVar30->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var31 != p_Var49) {
    do {
      Json::Value::Value((Value *)&local_598,objectValue);
      TargetId((string *)&local_698,*(cmGeneratorTarget **)(p_Var31 + 1),psVar20);
      Json::Value::Value((Value *)&local_620,(string *)&local_698);
      pVVar21 = Json::Value::operator[]((Value *)&local_598,"id");
      Json::Value::operator=(pVVar21,(Value *)&local_620);
      Json::Value::~Value((Value *)&local_620);
      if (local_698 != &local_688) {
        operator_delete(local_698.string_,(ulong)(local_688._M_allocated_capacity + 1));
      }
      AddBacktrace(this,(Value *)&local_598,(cmListFileBacktrace *)&p_Var31[1]._M_left);
      Json::Value::append(&local_328,(Value *)&local_598);
      Json::Value::~Value((Value *)&local_598);
      p_Var31 = (_Base_ptr)std::_Rb_tree_increment(p_Var31);
    } while ((_Rb_tree_header *)p_Var31 != p_Var49);
  }
  bVar16 = Json::Value::empty(&local_328);
  if (!bVar16) {
    Json::Value::Value(&local_1e8,&local_328);
    pVVar21 = Json::Value::operator[](local_660,"dependencies");
    Json::Value::operator=(pVVar21,&local_1e8);
    Json::Value::~Value(&local_1e8);
  }
  local_590 = (undefined1  [8])((ulong)local_590 & 0xffffffff00000000);
  local_588._0_5_ = 0;
  local_588._5_3_ = 0;
  local_588._8_5_ =
       SUB85((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_590,0);
  local_588[0xd] = (undefined1)((ulong)local_590 >> 0x28);
  local_588._14_2_ = (undefined2)((ulong)local_590 >> 0x30);
  local_570 = 0;
  local_588._16_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_590;
  cmGeneratorTarget::GetLanguages
            (this->GT,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_598,this->Config);
  paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT26(local_588._14_2_,CONCAT15(local_588[0xd],local_588._8_5_));
  if (paVar36 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590) {
    local_490 = (pointer)&this->CompileDataMap;
    local_450 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      p_Var15 = local_450;
      paVar60 = paVar36 + 2;
      iVar32 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
               ::lower_bound((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                              *)local_490,(key_type *)paVar60);
      if ((iVar32._M_node == p_Var15) ||
         (iVar18 = std::__cxx11::string::compare((string *)paVar60->_M_local_buf), iVar18 < 0)) {
        this_02 = (_Rb_tree_node_base *)operator_new(200);
        __k = (_Link_type)(this_02 + 1);
        *(_Base_ptr **)(this_02 + 1) = &this_02[1]._M_left;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__k,(&paVar36->_M_allocated_capacity)[4],
                   (&paVar36->_M_allocated_capacity)[5] + (&paVar36->_M_allocated_capacity)[4]);
        *(undefined8 *)(this_02 + 3) = 0;
        this_02[3]._M_parent = (_Base_ptr)0x0;
        this_02[3]._M_left = (_Base_ptr)0x0;
        this_02[3]._M_right = (_Base_ptr)0x0;
        this_02[2]._M_left = (_Base_ptr)0x0;
        this_02[2]._M_right = (_Base_ptr)0x0;
        *(_Base_ptr **)(this_02 + 2) = &this_02[2]._M_left;
        this_02[2]._M_parent = (_Base_ptr)0x0;
        *(_Base_ptr **)(this_02 + 3) = &this_02[3]._M_left;
        *(undefined8 *)(this_02 + 4) = 0;
        this_02[4]._M_parent = (_Base_ptr)0x0;
        this_02[4]._M_left = (_Base_ptr)0x0;
        this_02[4]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(this_02 + 5) = 0;
        this_02[5]._M_parent = (_Base_ptr)0x0;
        this_02[5]._M_left = (_Base_ptr)0x0;
        this_02[5]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(this_02 + 6) = 0;
        if (iVar32._M_node == p_Var15) {
          if (((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (__p = __k,
             iVar18 = std::__cxx11::string::compare
                                ((string *)
                                 ((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_right + 1)), -1 < iVar18)) {
LAB_002e104e:
            __p = __k;
            pVar66 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                     ::_M_get_insert_unique_pos
                               ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                                 *)local_490,(key_type *)__k);
          }
          else {
            p_Var58 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_002e1016:
            auVar13._8_8_ = 0;
            auVar13._0_8_ = p_Var58;
            pVar66 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar13 << 0x40);
          }
LAB_002e1064:
          iVar32._M_node = pVar66.first;
          if (pVar66.second == (_Rb_tree_node_base *)0x0) {
LAB_002e1094:
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
            ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                            *)this_02,__p);
            goto LAB_002e10d8;
          }
LAB_002e106c:
          iVar32._M_node = pVar66.second;
          bVar16 = true;
          if ((p_Var15 != iVar32._M_node) && (pVar66.first == (_Rb_tree_node_base *)0x0)) {
            std::__cxx11::string::compare((string *)__k);
            bVar16 = (bool)(extraout_var >> 7);
          }
        }
        else {
          __p = (_Link_type)(iVar32._M_node + 1);
          iVar18 = std::__cxx11::string::compare((string *)__k);
          if (-1 < iVar18) {
            __p = __k;
            iVar18 = std::__cxx11::string::compare((string *)(iVar32._M_node + 1));
            if (iVar18 < 0) {
              p_Var58 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
              ;
              if (p_Var58 == iVar32._M_node) goto LAB_002e1016;
              p_Var33 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar32._M_node);
              pVar66.second = p_Var33;
              pVar66.first = p_Var33;
              __p = (_Link_type)(p_Var33 + 1);
              iVar18 = std::__cxx11::string::compare((string *)__k);
              if (-1 < iVar18) goto LAB_002e104e;
              iVar34 = iVar32;
              if ((iVar32._M_node)->_M_right == (_Base_ptr)0x0) goto LAB_002e14d8;
              goto LAB_002e1064;
            }
            goto LAB_002e1094;
          }
          p_Var58 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pVar66.second = p_Var58;
          pVar66.first = p_Var58;
          if (p_Var58 == iVar32._M_node) goto LAB_002e1064;
          iVar34._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar32._M_node);
          iVar18 = std::__cxx11::string::compare((string *)(iVar34._M_node + 1));
          if (-1 < iVar18) goto LAB_002e104e;
          bVar16 = true;
          if ((iVar34._M_node)->_M_right == (_Base_ptr)0x0) {
LAB_002e14d8:
            auVar12._8_8_ = 0;
            auVar12._0_8_ = iVar34._M_node;
            pVar66 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar12 << 0x40);
            goto LAB_002e106c;
          }
        }
        std::_Rb_tree_insert_and_rebalance(bVar16,this_02,iVar32._M_node,p_Var15);
        psVar1 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        *psVar1 = *psVar1 + 1;
        iVar32._M_node = this_02;
      }
LAB_002e10d8:
      std::__cxx11::string::_M_assign((string *)(iVar32._M_node + 2));
      pcVar5 = this->GT->Makefile;
      local_620.string_ = (char *)&local_610;
      local_698.int_ = 0x15;
      local_620.int_ = std::__cxx11::string::_M_create(&local_620.uint_,(ulong)&local_698);
      local_610._M_allocated_capacity._0_4_ = (undefined4)local_698.int_;
      local_610._M_local_buf[4] = (char)((ulong)local_698 >> 0x20);
      local_610._M_local_buf[5] = (char)((ulong)local_698 >> 0x28);
      local_610._M_local_buf[6] = (char)((ulong)local_698 >> 0x30);
      local_610._M_local_buf[7] = (char)((ulong)local_698 >> 0x38);
      builtin_strncpy((char *)local_620,"CMAKE_SY",8);
      builtin_strncpy((char *)((long)&(local_620.map_)->_M_t + 8),"SROOT_CO",8);
      builtin_strncpy((char *)((long)&(local_620.map_)->_M_t + 0xd),"_COMPILE",8);
      local_618.int_ = local_698.int_;
      local_620.string_[local_698.string_] = '\0';
      pcVar22 = cmMakefile::GetDefinition(pcVar5,(string *)&local_620);
      if (local_620 != &local_610) {
        operator_delete(local_620.string_,
                        CONCAT17(local_610._M_local_buf[7],
                                 CONCAT16(local_610._M_local_buf[6],
                                          CONCAT15(local_610._M_local_buf[5],
                                                   CONCAT14(local_610._M_local_buf[4],
                                                            local_610._M_allocated_capacity._0_4_)))
                                ) + 1);
      }
      if (pcVar22 == (char *)0x0) {
        local_610._8_5_ = 0x544f4f5253;
        local_610._M_allocated_capacity._0_4_ = 0x4b414d43;
        local_610._M_local_buf[4] = 'E';
        local_610._M_local_buf[5] = '_';
        local_610._M_local_buf[6] = 'S';
        local_610._M_local_buf[7] = 'Y';
        local_618.int_ = 0xd;
        local_610._M_local_buf[0xd] = '\0';
        local_620.string_ = (char *)&local_610;
        pcVar22 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&local_620);
        if (local_620 != &local_610) {
          operator_delete(local_620.string_,
                          CONCAT17(local_610._M_local_buf[7],
                                   CONCAT16(local_610._M_local_buf[6],
                                            CONCAT15(local_610._M_local_buf[5],
                                                     CONCAT14(local_610._M_local_buf[4],
                                                              local_610._M_allocated_capacity._0_4_)
                                                    ))) + 1);
        }
        if (pcVar22 != (char *)0x0) goto LAB_002e1213;
      }
      else {
LAB_002e1213:
        p_Var31 = iVar32._M_node[3]._M_parent;
        strlen(pcVar22);
        std::__cxx11::string::_M_replace
                  ((ulong)(iVar32._M_node + 3),0,(char *)p_Var31,(ulong)pcVar22);
      }
      pcVar23 = cmGeneratorTarget::GetLocalGenerator(this->GT);
      local_620.string_ = (char *)&local_610;
      local_618.int_ = 0;
      local_610._M_allocated_capacity._0_4_ = local_610._M_allocated_capacity._0_4_ & 0xffffff00;
      cmLocalGenerator::GetTargetCompileFlags
                (pcVar23,this->GT,this->Config,(string *)paVar60,(string *)&local_620);
      local_698.int_ = 0;
      VStack_690.int_ = 0;
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string,cmListFileBacktrace>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 (iVar32._M_node + 4),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_620,
                 (cmListFileBacktrace *)&local_698);
      if (VStack_690 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)VStack_690.map_);
      }
      if (local_620 != &local_610) {
        operator_delete(local_620.string_,
                        CONCAT17(local_610._M_local_buf[7],
                                 CONCAT16(local_610._M_local_buf[6],
                                          CONCAT15(local_610._M_local_buf[5],
                                                   CONCAT14(local_610._M_local_buf[4],
                                                            local_610._M_allocated_capacity._0_4_)))
                                ) + 1);
      }
      cmLocalGenerator::GetTargetDefines
                ((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_620,pcVar23,this->GT,this->Config,(string *)paVar60);
      CompileData::SetDefines
                ((CompileData *)(iVar32._M_node + 2),
                 (set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_620);
      local_628 = paVar36;
      cmLocalGenerator::GetIncludeDirectories
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_698,pcVar23,this->GT,(string *)paVar60,this->Config);
      local_460.int_ = VStack_690.int_;
      VVar50 = local_698;
      if (local_698.int_ != VStack_690.int_) {
        do {
          paVar36 = paVar60;
          VVar54 = VVar50;
          bVar16 = cmGeneratorTarget::IsSystemIncludeDirectory
                             (this->GT,VVar50,this->Config,(string *)paVar60);
          local_658.bool_ = bVar16;
          pIVar35 = (pointer)iVar32._M_node[5]._M_right;
          if (pIVar35 == *(pointer *)(iVar32._M_node + 6)) {
            __first = (pointer)iVar32._M_node[5]._M_left;
            lVar41 = (long)pIVar35 - (long)__first;
            if (lVar41 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar64 = (lVar41 >> 3) * 0x6db6db6db6db6db7;
            uVar65 = uVar64 + (uVar64 == 0);
            p_Var62 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       *)(uVar65 + uVar64);
            if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                 *)0x249249249249248 < p_Var62) {
              p_Var62 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)0x249249249249249;
            }
            __alloc = (_Tp_alloc_type *)(uVar65 + uVar64);
            if (CARRY8(uVar65,uVar64)) {
              p_Var62 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)0x249249249249249;
            }
            __result = std::
                       _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       ::_M_allocate(p_Var62,VVar54.uint_);
            std::allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::
            construct<(anonymous_namespace)::CompileData::IncludeEntry,BT<std::__cxx11::string>const&,bool>
                      ((allocator_type *)(lVar41 + (long)__result),(IncludeEntry *)VVar50.map_,
                       (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_658,(bool *)__alloc);
            pIVar35 = std::
                      vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                      ::_S_relocate(__first,pIVar35,__result,__alloc);
            if (__first != (pointer)0x0) {
              operator_delete(__first,*(long *)(iVar32._M_node + 6) - (long)__first);
            }
            iVar32._M_node[5]._M_left = (_Base_ptr)__result;
            iVar32._M_node[5]._M_right = (_Base_ptr)(pIVar35 + 1);
            *(pointer *)(iVar32._M_node + 6) = __result + (long)p_Var62;
          }
          else {
            std::allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::
            construct<(anonymous_namespace)::CompileData::IncludeEntry,BT<std::__cxx11::string>const&,bool>
                      ((allocator_type *)pIVar35,(IncludeEntry *)VVar50.map_,
                       (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_658,(bool *)paVar36->_M_local_buf);
            iVar32._M_node[5]._M_right = (_Base_ptr)&iVar32._M_node[5]._M_right[1]._M_right;
          }
          VVar50.string_ = (char *)(VVar50.int_ + 0x30);
        } while (VVar50.int_ != local_460.int_);
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_698);
      std::
      _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_620);
      paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_628);
    } while (paVar36 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_590);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_598);
  Json::Value::Value(&local_350,arrayValue);
  pKVar37 = cmGeneratorTarget::GetKindedSources(this->GT,this->Config);
  pSVar57 = (pKVar37->Sources).
            super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_490 = (pKVar37->Sources).
              super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar57 != local_490) {
    local_450 = (_Rb_tree_node_base *)&this->SourceGroupsLocal;
    local_3f0 = &(this->SourceGroupsMap)._M_h;
    local_3c0 = &this->CompileDataMap;
    local_3c8 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_3f8 = (_Rb_tree<Json::Value,std::pair<Json::Value_const,unsigned_int>,std::_Select1st<std::pair<Json::Value_const,unsigned_int>>,std::less<Json::Value>,std::allocator<std::pair<Json::Value_const,unsigned_int>>>
                 *)&this->CompileGroupMap;
    local_3b8 = &(this->CompileGroupMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      AVar19 = Json::Value::size(&local_350);
      local_460.uint_._0_4_ = AVar19;
      Json::Value::Value(&local_2b0,objectValue);
      psVar20 = cmSourceFile::GetFullPath((pSVar57->Source).Value,(string *)0x0);
      local_3e8._M_allocated_capacity = (size_type)&local_3d8;
      pcVar6 = (psVar20->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3e8,pcVar6,pcVar6 + psVar20->_M_string_length);
      RelativeIfUnder((string *)&local_620,local_3b0,(string *)&local_3e8);
      Json::Value::Value(&local_58,(string *)&local_620);
      pVVar21 = Json::Value::operator[](&local_2b0,"path");
      Json::Value::operator=(pVVar21,&local_58);
      Json::Value::~Value(&local_58);
      if (local_620 != &local_610) {
        operator_delete(local_620.string_,
                        CONCAT17(local_610._M_local_buf[7],
                                 CONCAT16(local_610._M_local_buf[6],
                                          CONCAT15(local_610._M_local_buf[5],
                                                   CONCAT14(local_610._M_local_buf[4],
                                                            local_610._M_allocated_capacity._0_4_)))
                                ) + 1);
      }
      if (((pSVar57->Source).Value)->IsGenerated == true) {
        Json::Value::Value(&local_80,true);
        pVVar21 = Json::Value::operator[](&local_2b0,"isGenerated");
        Json::Value::operator=(pVVar21,&local_80);
        Json::Value::~Value(&local_80);
      }
      AddBacktrace(this,&local_2b0,&(pSVar57->Source).Backtrace);
      VVar50.map_ = (ObjectValues *)
                    cmMakefile::FindSourceGroup
                              (this->GT->Makefile,(string *)&local_3e8,
                               (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)local_450);
      if ((cmSourceGroup *)VVar50.int_ != (cmSourceGroup *)0x0) {
        local_598.map_ = VVar50.map_;
        _Var38._M_cur =
             (__node_type *)
             std::
             _Hashtable<const_cmSourceGroup_*,_std::pair<const_cmSourceGroup_*const,_unsigned_int>,_std::allocator<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmSourceGroup_*>,_std::hash<const_cmSourceGroup_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(local_3f0,(key_type *)&local_598.map_);
        if (_Var38._M_cur == (__node_type *)0x0) {
          local_698.int_._0_4_ =
               (int)((ulong)((long)(this->SourceGroups).
                                   super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->SourceGroups).
                                  super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
          pVar67 = std::
                   _Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   ::_M_emplace<cmSourceGroup*&,unsigned_int&>
                             ((_Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                               *)local_3f0,&local_598,&local_698);
          _Var38._M_cur =
               (__node_type *)
               pVar67.first.
               super__Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
               ._M_cur;
          local_620.string_ = (char *)&local_610;
          local_618.int_ = 0;
          local_610._M_allocated_capacity._0_4_ = local_610._M_allocated_capacity._0_4_ & 0xffffff00
          ;
          Json::Value::Value((Value *)&local_600,arrayValue);
          cmSourceGroup::GetFullName_abi_cxx11_((cmSourceGroup *)local_598.map_);
          std::__cxx11::string::_M_assign((string *)&local_620.bool_);
          pSVar52 = (this->SourceGroups).
                    super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar52 ==
              (this->SourceGroups).
              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pSVar10 = (this->SourceGroups).
                      super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((long)pSVar52 - (long)pSVar10 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            lVar41 = (long)pSVar52 - (long)pSVar10 >> 3;
            uVar65 = lVar41 * -0x71c71c71c71c71c7;
            uVar64 = uVar65;
            if (pSVar52 == pSVar10) {
              uVar64 = 1;
            }
            local_628 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(uVar64 + uVar65);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x1c71c71c71c71c6 < local_628) {
              local_628 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x1c71c71c71c71c7;
            }
            if (CARRY8(uVar64,uVar65)) {
              local_628 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x1c71c71c71c71c7;
            }
            if (local_628 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              pSVar39 = (pointer)0x0;
              __args_00 = __args;
            }
            else {
              pSVar39 = (pointer)operator_new((long)local_628 * 0x48);
              __args_00 = extraout_RDX;
            }
            local_488 = (_Base_ptr)(&(pSVar39->Name)._M_dataplus + lVar41);
            std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
            construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                      ((allocator_type *)local_488,(SourceGroup *)&local_620,__args_00);
            pSVar61 = pSVar39;
            pSVar59 = pSVar10;
            if (pSVar52 == pSVar10) {
              pSVar53 = pSVar39 + 1;
              paVar36 = local_628;
            }
            else {
              do {
                pSVar53 = pSVar61;
                (pSVar53->Name)._M_dataplus._M_p = (pointer)&(pSVar53->Name).field_2;
                pcVar6 = (pSVar59->Name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)pSVar53,pcVar6,pcVar6 + (pSVar59->Name)._M_string_length);
                Json::Value::Value(&pSVar53->SourceIndexes,&pSVar59->SourceIndexes);
                paVar36 = local_628;
                pSVar59 = pSVar59 + 1;
                pSVar61 = pSVar53 + 1;
              } while (pSVar59 != pSVar52);
              paVar60 = &(pSVar10->Name).field_2;
              do {
                Json::Value::~Value((Value *)(paVar60->_M_local_buf + 0x10));
                if (paVar60 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*(long **)(paVar60->_M_local_buf + -0x10)) {
                  operator_delete(*(long **)(paVar60->_M_local_buf + -0x10),
                                  paVar60->_M_allocated_capacity + 1);
                }
                pSVar61 = (pointer)(paVar60->_M_local_buf + 0x38);
                paVar60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar60->_M_local_buf + 0x48);
              } while (pSVar61 != pSVar52);
              pSVar53 = pSVar53 + 2;
            }
            if (pSVar10 != (pointer)0x0) {
              operator_delete(pSVar10,(long)(this->SourceGroups).
                                            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pSVar10);
            }
            (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_start = pSVar39;
            (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish = pSVar53;
            (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar39 + (long)paVar36;
          }
          else {
            std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
            construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                      ((allocator_type *)pSVar52,(SourceGroup *)&local_620,__args);
            ppSVar2 = &(this->SourceGroups).
                       super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar2 = *ppSVar2 + 1;
          }
          Json::Value::~Value((Value *)&local_600);
          if (local_620 != &local_610) {
            operator_delete(local_620.string_,
                            CONCAT17(local_610._M_local_buf[7],
                                     CONCAT16(local_610._M_local_buf[6],
                                              CONCAT15(local_610._M_local_buf[5],
                                                       CONCAT14(local_610._M_local_buf[4],
                                                                local_610._M_allocated_capacity.
                                                                _0_4_)))) + 1);
          }
        }
        uVar4 = *(uint *)((long)&((_Var38._M_cur)->
                                 super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                                 ._M_storage._M_storage + 8);
        pSVar52 = (this->SourceGroups).
                  super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_620,local_460._0_4_);
        Json::Value::append(&pSVar52[uVar4].SourceIndexes,(Value *)&local_620);
        Json::Value::~Value((Value *)&local_620);
        Json::Value::Value(&local_a8,
                           *(UInt *)((long)&((_Var38._M_cur)->
                                            super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                                            ._M_storage._M_storage + 8));
        pVVar21 = Json::Value::operator[](&local_2b0,"sourceGroupIndex");
        Json::Value::operator=(pVVar21,&local_a8);
        Json::Value::~Value(&local_a8);
      }
      if (pSVar57->Kind == SourceKindObjectSource) {
        this_00 = (pSVar57->Source).Value;
        local_620.string_ = (char *)&local_610;
        local_618.int_ = 0;
        local_610._M_allocated_capacity._0_4_ = local_610._M_allocated_capacity._0_4_ & 0xffffff00;
        local_600.string_ = local_5f0;
        local_5f8 = 0;
        local_5f0[0] = 0;
        local_5a0 = (ValueHolder *)0x0;
        local_5b0 = (ValueHolder *)0x0;
        pVStack_5a8 = (ValueHolder *)0x0;
        local_5c0 = (string *)0x0;
        uStack_5b8 = 0;
        local_5d0 = 0;
        psStack_5c8 = (string *)0x0;
        local_5e0._M_allocated_capacity = 0;
        local_5e0._8_8_ =
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )0x0;
        cmSourceFile::GetLanguage_abi_cxx11_((string *)&local_598,this_00);
        std::__cxx11::string::operator=((string *)&local_620.bool_,(string *)&local_598.bool_);
        if (local_598 != (cmSourceGroup *)(local_590 + 8)) {
          operator_delete(local_598.string_,CONCAT35(local_588._5_3_,local_588._0_5_) + 1);
        }
        if (local_618 != (string *)0x0) {
          iVar32 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                   ::lower_bound(local_3c0,(key_type *)&local_620);
          if ((iVar32._M_node == local_3c8) ||
             (iVar18 = std::__cxx11::string::compare((string *)&local_620.bool_), iVar18 < 0)) {
            std::__throw_out_of_range("map::at");
LAB_002e3324:
            std::__throw_length_error("vector::_M_range_insert");
          }
          std::__cxx11::string::_M_assign((string *)&local_600.bool_);
          local_628 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)cmGeneratorTarget::GetLocalGenerator(this->GT);
          local_530[0].string_ = (char *)&local_520;
          pcVar6 = (this->Config->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_530,pcVar6,pcVar6 + this->Config->_M_string_length);
          headTarget = this->GT;
          local_4e0.string_ = (char *)&local_4d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4e0,local_620.int_,local_618.string_ + local_620.string_);
          cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                    ((cmGeneratorExpressionInterpreter *)&local_598,(cmLocalGenerator *)local_628,
                     (string *)local_530,headTarget,(string *)&local_4e0);
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0.string_,local_4d0._M_allocated_capacity + 1);
          }
          if (local_530[0] != &local_520) {
            operator_delete(local_530[0].string_,local_520._M_allocated_capacity + 1);
          }
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_5e0,
                      (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(iVar32._M_node + 4));
          local_508.string_ = (char *)&local_4f8;
          local_4f8._8_5_ = 0x5347414c46;
          local_4f8._M_allocated_capacity._0_5_ = 0x49504d4f43;
          local_4f8._M_allocated_capacity._5_3_ = 0x5f454c;
          paStack_500 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0xd;
          local_4f8._M_local_buf[0xd] = '\0';
          pcVar22 = cmSourceFile::GetProperty(this_00,(string *)&local_508);
          if (pcVar22 != (char *)0x0) {
            psVar20 = cmGeneratorExpressionInterpreter::Evaluate
                                ((cmGeneratorExpressionInterpreter *)&local_598,pcVar22,
                                 (string *)&local_508);
            pcVar6 = (psVar20->_M_dataplus)._M_p;
            local_698.string_ = (char *)&local_688;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_698,pcVar6,pcVar6 + psVar20->_M_string_length);
            local_658.int_ = 0;
            psStack_650 = (string *)0x0;
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string,cmListFileBacktrace>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       local_5e0._M_local_buf,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_698,(cmListFileBacktrace *)&local_658);
            if (psStack_650 != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psStack_650);
            }
            if (local_698 != &local_688) {
              operator_delete(local_698.string_,(ulong)(local_688._M_allocated_capacity + 1));
            }
          }
          local_4b8._M_allocated_capacity = (size_type)&local_4a8;
          local_4a8._8_7_ = 0x534e4f4954504f;
          local_4a8._M_allocated_capacity._0_7_ = 0x454c49504d4f43;
          local_4a8._M_local_buf[7] = '_';
          local_4b8._8_8_ = 0xf;
          local_4a8._M_local_buf[0xf] = '\0';
          pcVar22 = cmSourceFile::GetProperty(this_00,(string *)&local_4b8);
          if (pcVar22 != (char *)0x0) {
            VStack_690.int_ = 0;
            local_688._M_allocated_capacity = local_688._M_allocated_capacity & 0xffffffffffffff00;
            local_698.string_ = (char *)&local_688;
            psVar20 = cmGeneratorExpressionInterpreter::Evaluate
                                ((cmGeneratorExpressionInterpreter *)&local_598,pcVar22,
                                 (string *)&local_4b8);
            cmLocalGenerator::AppendCompileOptions
                      ((cmLocalGenerator *)local_628,(string *)&local_698,
                       (psVar20->_M_dataplus)._M_p,(char *)0x0);
            local_658.int_ = 0;
            psStack_650 = (string *)0x0;
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string,cmListFileBacktrace>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       local_5e0._M_local_buf,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_698,(cmListFileBacktrace *)&local_658);
            if (psStack_650 != (string *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psStack_650);
            }
            if (local_698 != &local_688) {
              operator_delete(local_698.string_,(ulong)(local_688._M_allocated_capacity + 1));
            }
          }
          local_658.int_ = 0;
          psStack_650 = (string *)0x0;
          local_648._M_dataplus._M_p = (pointer)0x0;
          local_480.int_ = 0x13;
          pVVar55 = &local_698;
          local_698.string_ = (char *)&local_688;
          local_698.int_ = std::__cxx11::string::_M_create(&pVVar55->uint_,(ulong)&local_480);
          local_688._M_allocated_capacity = (size_type)local_480;
          builtin_strncpy((char *)local_698,"INCLUDE_",8);
          *(undefined8 *)((long)&(local_698.map_)->_M_t + 8) = 0x524f544345524944;
          builtin_strncpy((char *)((long)&(local_698.map_)->_M_t + 0xf),"RIES",4);
          VStack_690.int_ = local_480.int_;
          local_698.string_[local_480.string_] = '\0';
          local_488 = iVar32._M_node;
          local_458 = pSVar57;
          pcVar22 = cmSourceFile::GetProperty(this_00,(string *)pVVar55);
          if (pcVar22 != (char *)0x0) {
            psVar20 = cmGeneratorExpressionInterpreter::Evaluate
                                ((cmGeneratorExpressionInterpreter *)&local_598,pcVar22,
                                 (string *)&local_698);
            pVVar55 = &local_658;
            cmLocalGenerator::AppendIncludeDirectories
                      ((cmLocalGenerator *)local_628,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pVVar55,(psVar20->_M_dataplus)._M_p,this_00);
            psVar20 = psStack_650;
            for (VVar50 = local_658; VVar50 != psVar20;
                VVar50.string_ = (char *)((long)&((VVar50.map_)->_M_t)._M_impl.field_0x0 + 0x20)) {
              VVar54 = VVar50;
              bVar16 = cmGeneratorTarget::IsSystemIncludeDirectory
                                 (this->GT,VVar50,this->Config,(string *)&local_620);
              pVVar55 = pVStack_5a8;
              pVVar63 = local_5b0;
              local_480.bool_ = bVar16;
              if (pVStack_5a8 == local_5a0) {
                lVar41 = (long)pVStack_5a8 - (long)local_5b0;
                if (lVar41 == 0x7ffffffffffffff8) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar64 = (lVar41 >> 3) * 0x6db6db6db6db6db7;
                uVar65 = uVar64 + (uVar64 == 0);
                p_Var62 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                           *)(uVar65 + uVar64);
                if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                     *)0x249249249249248 < p_Var62) {
                  p_Var62 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                             *)0x249249249249249;
                }
                if (CARRY8(uVar65,uVar64)) {
                  p_Var62 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                             *)0x249249249249249;
                }
                pVVar43 = (ValueHolder *)
                          std::
                          _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                          ::_M_allocate(p_Var62,VVar54.uint_);
                pVVar40 = &local_480;
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>::
                construct<(anonymous_namespace)::CompileData::IncludeEntry,std::__cxx11::string_const&,bool_const&>
                          ((allocator_type *)(lVar41 + (long)pVVar43),
                           *(IncludeEntry **)VVar50.string_,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            ((long)&((VVar50.map_)->_M_t)._M_impl.field_0x0 + 8),&pVVar40->bool_);
                pVVar40 = (ValueHolder *)
                          std::
                          vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                          ::_S_relocate((pointer)pVVar63,(pointer)pVVar55,(pointer)pVVar43,
                                        (_Tp_alloc_type *)&pVVar40->bool_);
                if (pVVar63 != (ValueHolder *)0x0) {
                  pVVar55 = (ValueHolder *)((long)local_5a0 - (long)pVVar63);
                  operator_delete(pVVar63,(ulong)pVVar55);
                }
                local_5a0 = pVVar43 + (long)p_Var62 * 7;
                local_5b0 = pVVar43;
              }
              else {
                pVVar55 = *(ValueHolder **)VVar50.string_;
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>::
                construct<(anonymous_namespace)::CompileData::IncludeEntry,std::__cxx11::string_const&,bool_const&>
                          ((allocator_type *)&pVStack_5a8->bool_,(IncludeEntry *)pVVar55,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            ((long)&((VVar50.map_)->_M_t)._M_impl.field_0x0 + 8),&local_480.bool_);
                pVVar40 = pVStack_5a8;
              }
              pVStack_5a8 = pVVar40 + 7;
            }
          }
          if (local_698 != &local_688) {
            pVVar55 = (ValueHolder *)(local_688._M_allocated_capacity + 1);
            operator_delete(local_698.string_,(ulong)pVVar55);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_658);
          pVVar63 = pVStack_5a8;
          p_Var31 = local_488[5]._M_left;
          p_Var7 = local_488[5]._M_right;
          if (p_Var31 != p_Var7) {
            uVar64 = (long)p_Var7 - (long)p_Var31;
            if ((ulong)((long)local_5a0 - (long)pVStack_5a8) < uVar64) {
              uVar65 = ((long)uVar64 >> 3) * 0x6db6db6db6db6db7;
              lVar41 = (long)pVStack_5a8 - (long)local_5b0 >> 3;
              uVar42 = lVar41 * 0x6db6db6db6db6db7;
              if (lVar41 * -0x6db6db6db6db6db7 + 0x249249249249249U < uVar65) goto LAB_002e3324;
              if (uVar65 <= uVar42 && uVar42 + ((long)uVar64 >> 3) * -0x6db6db6db6db6db7 != 0) {
                uVar65 = uVar42;
              }
              p_Var62 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)(uVar65 + uVar42);
              if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   *)0x249249249249248 < p_Var62) {
                p_Var62 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                           *)0x249249249249249;
              }
              if (CARRY8(uVar65,uVar42)) {
                p_Var62 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                           *)0x249249249249249;
              }
              pVVar43 = (ValueHolder *)
                        std::
                        _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                        ::_M_allocate(p_Var62,(size_t)pVVar55);
              pVVar40 = pVVar43;
              for (pVVar55 = local_5b0; local_400 = p_Var62, pVVar55 != pVVar63;
                  pVVar55 = pVVar55 + 7) {
                pVVar40->string_ = (char *)(pVVar40 + 2);
                pVVar14 = pVVar55 + 2;
                if (pVVar14 == (ValueHolder *)pVVar55->int_) {
                  VVar50 = pVVar55[3];
                  pVVar40[2] = *pVVar14;
                  pVVar40[3] = VVar50;
                }
                else {
                  pVVar40->int_ = pVVar55->int_;
                  pVVar40[2] = *pVVar14;
                }
                pVVar40[1] = pVVar55[1];
                pVVar55->string_ = (char *)pVVar14;
                pVVar55[1].int_ = 0;
                pVVar55[2].bool_ = false;
                VVar50 = pVVar55[5];
                pVVar55[5].int_ = 0;
                pVVar40[4] = pVVar55[4];
                pVVar40[5] = VVar50;
                pVVar55[4].int_ = 0;
                pVVar40[6].bool_ = pVVar55[6].bool_;
                pVVar40 = pVVar40 + 7;
              }
              do {
                pVVar55 = pVVar40;
                pVVar55->string_ = (char *)(pVVar55 + 2);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)pVVar55,*(long *)p_Var31,
                           (long)&p_Var31->_M_parent->_M_color + *(long *)p_Var31);
                pVVar55[4] = *(ValueHolder *)(p_Var31 + 1);
                _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var31[1]._M_parent;
                pVVar55[5].map_ = (ObjectValues *)_Var8._M_pi;
                if ((_Base_ptr)_Var8._M_pi != (_Base_ptr)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (_Var8._M_pi)->_M_use_count = (_Var8._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (_Var8._M_pi)->_M_use_count = (_Var8._M_pi)->_M_use_count + 1;
                  }
                }
                pVVar55[6].bool_ = *(bool *)&p_Var31[1]._M_left;
                p_Var31 = (_Base_ptr)&p_Var31[1]._M_right;
                pVVar40 = pVVar55 + 7;
              } while (p_Var31 != p_Var7);
              pVVar14 = local_5b0;
              if (pVStack_5a8 != pVVar63) {
                lVar41 = 0;
                do {
                  lVar46 = lVar41;
                  puVar27 = (undefined8 *)((long)pVVar40 + lVar46);
                  *puVar27 = puVar27 + 2;
                  pbVar48 = &pVVar63->bool_ + lVar46 + 0x10;
                  if (pbVar48 == *(bool **)(&pVVar63->bool_ + lVar46)) {
                    uVar56 = *(undefined8 *)(&pVVar63->bool_ + lVar46 + 0x18);
                    puVar27[2] = *(long *)pbVar48;
                    puVar27[3] = uVar56;
                  }
                  else {
                    *(long *)((long)pVVar40 + lVar46) = (long)*(bool **)(&pVVar63->bool_ + lVar46);
                    ((long *)((long)pVVar40 + lVar46))[2] = *(long *)pbVar48;
                  }
                  *(undefined8 *)((long)pVVar55 + lVar46 + 0x40) =
                       *(undefined8 *)(&pVVar63->bool_ + lVar46 + 8);
                  *(bool **)(&pVVar63->bool_ + lVar46) = pbVar48;
                  pbVar48 = &pVVar63->bool_ + lVar46 + 8;
                  pbVar48[0] = false;
                  pbVar48[1] = false;
                  pbVar48[2] = false;
                  pbVar48[3] = false;
                  pbVar48[4] = false;
                  pbVar48[5] = false;
                  pbVar48[6] = false;
                  pbVar48[7] = false;
                  (&pVVar63->bool_)[lVar46 + 0x10] = false;
                  *(undefined8 *)((long)pVVar55 + lVar46 + 0x60) = 0;
                  uVar56 = *(undefined8 *)(&pVVar63->bool_ + lVar46 + 0x20);
                  uVar51 = *(undefined8 *)(&pVVar63->bool_ + lVar46 + 0x20 + 8);
                  pbVar48 = &pVVar63->bool_ + lVar46 + 0x28;
                  pbVar48[0] = false;
                  pbVar48[1] = false;
                  pbVar48[2] = false;
                  pbVar48[3] = false;
                  pbVar48[4] = false;
                  pbVar48[5] = false;
                  pbVar48[6] = false;
                  pbVar48[7] = false;
                  puVar27 = (undefined8 *)((long)pVVar55 + lVar46 + 0x58);
                  *puVar27 = uVar56;
                  puVar27[1] = uVar51;
                  pbVar48 = &pVVar63->bool_ + lVar46 + 0x20;
                  pbVar48[0] = false;
                  pbVar48[1] = false;
                  pbVar48[2] = false;
                  pbVar48[3] = false;
                  pbVar48[4] = false;
                  pbVar48[5] = false;
                  pbVar48[6] = false;
                  pbVar48[7] = false;
                  *(bool *)((long)pVVar55 + lVar46 + 0x68) = (&pVVar63->bool_)[lVar46 + 0x30];
                  lVar41 = lVar46 + 0x38;
                } while ((ValueHolder *)(&pVVar63->bool_ + lVar46 + 0x38) != pVStack_5a8);
                pVVar40 = (ValueHolder *)((long)pVVar55 + lVar46 + 0x70);
                pVVar63 = pVStack_5a8;
              }
              for (; pVVar14 != pVVar63; pVVar14 = pVVar14 + 7) {
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVVar14[5].map_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVVar14[5].map_);
                }
                if (pVVar14 + 2 != (ValueHolder *)pVVar14->string_) {
                  operator_delete((ValueHolder *)pVVar14->string_,pVVar14[2].int_ + 1);
                }
              }
              if (local_5b0 != (ValueHolder *)0x0) {
                operator_delete(local_5b0,(long)local_5a0 - (long)local_5b0);
              }
              local_5a0 = pVVar43 + (long)local_400 * 7;
              local_5b0 = pVVar43;
              pVStack_5a8 = pVVar40;
            }
            else {
              do {
                pVVar63->string_ = (char *)(pVVar63 + 2);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)pVVar63,*(long *)p_Var31,
                           (long)&p_Var31->_M_parent->_M_color + *(long *)p_Var31);
                pVVar63[4] = *(ValueHolder *)(p_Var31 + 1);
                _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var31[1]._M_parent;
                pVVar63[5].map_ = (ObjectValues *)_Var8._M_pi;
                if ((_Base_ptr)_Var8._M_pi != (_Base_ptr)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (_Var8._M_pi)->_M_use_count = (_Var8._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (_Var8._M_pi)->_M_use_count = (_Var8._M_pi)->_M_use_count + 1;
                  }
                }
                pVVar63[6].bool_ = *(bool *)&p_Var31[1]._M_left;
                p_Var31 = (_Base_ptr)&p_Var31[1]._M_right;
                pVVar63 = pVVar63 + 7;
              } while (p_Var31 != p_Var7);
              pVStack_5a8 = (ValueHolder *)(&pVStack_5a8->bool_ + uVar64);
            }
          }
          local_480.string_ = (char *)&local_470;
          local_698.int_ = 0x13;
          local_480.int_ = std::__cxx11::string::_M_create(&local_480.uint_,(ulong)&local_698);
          local_470._M_allocated_capacity = (size_type)local_698;
          builtin_strncpy((char *)local_480,"COMPILE_",8);
          *(undefined8 *)((long)&(local_480.map_)->_M_t + 8) = 0x4954494e49464544;
          builtin_strncpy((char *)((long)&(local_480.map_)->_M_t + 0xf),"IONS",4);
          local_478.int_ = local_698.int_;
          local_480.string_[local_698.string_] = '\0';
          VStack_690.uint_ = VStack_690.uint_ & 0xffffffff00000000;
          local_688._M_allocated_capacity = 0;
          local_688._8_8_ = &VStack_690;
          local_670 = 0;
          local_678 = (ValueHolder *)local_688._8_8_;
          pcVar22 = cmSourceFile::GetProperty(this_00,(string *)&local_480);
          pSVar57 = local_458;
          if (pcVar22 != (char *)0x0) {
            psVar20 = cmGeneratorExpressionInterpreter::Evaluate
                                ((cmGeneratorExpressionInterpreter *)&local_598,pcVar22,
                                 (string *)&local_480);
            cmLocalGenerator::AppendDefines
                      ((cmLocalGenerator *)local_628,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_698,psVar20);
          }
          cmsys::SystemTools::UpperCase((string *)&local_658,this->Config);
          plVar44 = (long *)std::__cxx11::string::replace((ulong)&local_658,0,(char *)0x0,0x5135d8);
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          psVar47 = (size_type *)(plVar44 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar44 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar47) {
            local_420.field_2._M_allocated_capacity = *psVar47;
            local_420.field_2._8_8_ = plVar44[3];
          }
          else {
            local_420.field_2._M_allocated_capacity = *psVar47;
            local_420._M_dataplus._M_p = (pointer)*plVar44;
          }
          local_420._M_string_length = plVar44[1];
          *plVar44 = (long)psVar47;
          plVar44[1] = 0;
          *(undefined1 *)(plVar44 + 2) = 0;
          if (local_658 != &local_648) {
            operator_delete(local_658.string_,(ulong)(local_648._M_dataplus._M_p + 1));
          }
          pcVar22 = cmSourceFile::GetProperty(this_00,&local_420);
          if (pcVar22 != (char *)0x0) {
            psVar20 = cmGeneratorExpressionInterpreter::Evaluate
                                ((cmGeneratorExpressionInterpreter *)&local_598,pcVar22,
                                 (string *)&local_480);
            cmLocalGenerator::AppendDefines
                      ((cmLocalGenerator *)local_628,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_698,psVar20);
          }
          psStack_650 = (string *)((ulong)psStack_650 & 0xffffffff00000000);
          local_648._M_dataplus._M_p = (pointer)0x0;
          local_648._M_string_length = (size_type)&psStack_650;
          local_648.field_2._8_8_ = 0;
          local_648.field_2._M_allocated_capacity = local_648._M_string_length;
          std::
          _Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
          ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                    ((_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                      *)&local_658.bool_,
                     (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_688._8_8_,(_Base_ptr)&VStack_690);
          pBVar9 = *(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)(local_488 + 5);
          local_3a8._M_t =
               (_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_658;
          for (__v = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_488[4]._M_right; __v != pBVar9; __v = __v + 1) {
            std::
            _Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
            ::
            _M_insert_unique_<BT<std::__cxx11::string>const&,std::_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>::_Alloc_node>
                      ((_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                        *)&local_658.bool_,(_Base_ptr)&psStack_650,__v,&local_3a8);
          }
          CompileData::SetDefines
                    ((CompileData *)&local_620,
                     (set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_658);
          std::
          _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_658);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_698);
          if (local_480 != &local_470) {
            operator_delete(local_480.string_,(ulong)(local_470._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_allocated_capacity != &local_4a8) {
            operator_delete((void *)local_4b8._M_allocated_capacity,
                            CONCAT17(local_4a8._M_local_buf[7],local_4a8._M_allocated_capacity._0_7_
                                    ) + 1);
          }
          if (local_508 != &local_4f8) {
            operator_delete(local_508.string_,
                            CONCAT35(local_4f8._M_allocated_capacity._5_3_,
                                     local_4f8._M_allocated_capacity._0_5_) + 1);
          }
          if (local_550 != &local_540) {
            operator_delete(local_550,local_540._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._16_8_ != &local_568) {
            operator_delete((void *)local_588._16_8_,local_568._M_allocated_capacity + 1);
          }
          std::
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)(local_590 + 8));
          cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_598);
        }
        Json::Value::Value((Value *)&local_448,objectValue);
        psVar20 = extraout_RDX_00;
        if (local_618 != (string *)0x0) {
          Json::Value::Value((Value *)&local_658,(string *)&local_620);
          pVVar21 = Json::Value::operator[]((Value *)&local_448,"language");
          Json::Value::operator=(pVVar21,(Value *)&local_658);
          Json::Value::~Value((Value *)&local_658);
          psVar20 = extraout_RDX_01;
        }
        if (local_5f8 != 0) {
          DumpSysroot((Value *)local_530,(Target *)&local_600,psVar20);
          pVVar21 = Json::Value::operator[]((Value *)&local_448,"sysroot");
          Json::Value::operator=(pVVar21,(Value *)local_530);
          Json::Value::~Value((Value *)local_530);
        }
        if (local_5e0._M_allocated_capacity != local_5e0._8_8_) {
          Json::Value::Value((Value *)&local_4e0,arrayValue);
          uVar56 = local_5e0._8_8_;
          for (uVar51 = local_5e0._M_allocated_capacity; uVar51 != uVar56; uVar51 = uVar51 + 0x30) {
            VStack_690.int_ = 0;
            local_688._M_allocated_capacity = local_688._M_allocated_capacity & 0xffffffffffffff00;
            local_698.string_ = (char *)&local_688;
            DumpCommandFragment((Value *)&local_598,this,
                                (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)uVar51,(string *)&local_698);
            Json::Value::append((Value *)&local_4e0,(Value *)&local_598);
            Json::Value::~Value((Value *)&local_598);
            if (local_698 != &local_688) {
              operator_delete(local_698.string_,(ulong)(local_688._M_allocated_capacity + 1));
            }
          }
          pVVar21 = Json::Value::operator[]((Value *)&local_448,"compileCommandFragments");
          Json::Value::operator=(pVVar21,(Value *)&local_4e0);
          Json::Value::~Value((Value *)&local_4e0);
        }
        if (local_5b0 != pVStack_5a8) {
          Json::Value::Value((Value *)&local_508,arrayValue);
          pVVar63 = pVStack_5a8;
          for (pVVar55 = local_5b0; pVVar55 != pVVar63; pVVar55 = pVVar55 + 7) {
            Json::Value::Value((Value *)&local_4b8,objectValue);
            Json::Value::Value((Value *)&local_598,(string *)pVVar55);
            pVVar21 = Json::Value::operator[]((Value *)&local_4b8,"path");
            Json::Value::operator=(pVVar21,(Value *)&local_598);
            Json::Value::~Value((Value *)&local_598);
            if (pVVar55[6].bool_ == true) {
              Json::Value::Value((Value *)&local_698,true);
              pVVar21 = Json::Value::operator[]((Value *)&local_4b8,"isSystem");
              Json::Value::operator=(pVVar21,(Value *)&local_698);
              Json::Value::~Value((Value *)&local_698);
            }
            AddBacktrace(this,(Value *)&local_4b8,(cmListFileBacktrace *)(pVVar55 + 4));
            Json::Value::append((Value *)&local_508,(Value *)&local_4b8);
            Json::Value::~Value((Value *)&local_4b8);
          }
          Json::Value::Value((Value *)&local_698,(Value *)&local_508);
          pVVar21 = Json::Value::operator[]((Value *)&local_448,"includes");
          Json::Value::operator=(pVVar21,(Value *)&local_698);
          Json::Value::~Value((Value *)&local_698);
          Json::Value::~Value((Value *)&local_508);
        }
        if (psStack_5c8 != local_5c0) {
          Json::Value::Value((Value *)&local_508,arrayValue);
          psVar24 = local_5c0;
          for (psVar20 = psStack_5c8; psVar20 != psVar24; psVar20 = (string *)&psVar20[1].field_2) {
            Json::Value::Value((Value *)&local_4b8,objectValue);
            Json::Value::Value((Value *)&local_598,psVar20);
            pVVar21 = Json::Value::operator[]((Value *)&local_4b8,"define");
            Json::Value::operator=(pVVar21,(Value *)&local_598);
            Json::Value::~Value((Value *)&local_598);
            AddBacktrace(this,(Value *)&local_4b8,(cmListFileBacktrace *)(psVar20 + 1));
            Json::Value::append((Value *)&local_508,(Value *)&local_4b8);
            Json::Value::~Value((Value *)&local_4b8);
          }
          Json::Value::Value((Value *)&local_598,(Value *)&local_508);
          pVVar21 = Json::Value::operator[]((Value *)&local_448,"defines");
          Json::Value::operator=(pVVar21,(Value *)&local_598);
          Json::Value::~Value((Value *)&local_598);
          Json::Value::~Value((Value *)&local_508);
        }
        CompileData::~CompileData((CompileData *)&local_620);
        VVar50 = (ValueHolder)
                 std::
                 _Rb_tree<Json::Value,_std::pair<const_Json::Value,_unsigned_int>,_std::_Select1st<std::pair<const_Json::Value,_unsigned_int>_>,_std::less<Json::Value>,_std::allocator<std::pair<const_Json::Value,_unsigned_int>_>_>
                 ::find((_Rb_tree<Json::Value,_std::pair<const_Json::Value,_unsigned_int>,_std::_Select1st<std::pair<const_Json::Value,_unsigned_int>_>,_std::less<Json::Value>,_std::allocator<std::pair<const_Json::Value,_unsigned_int>_>_>
                         *)local_3f8,(key_type *)&local_448);
        if ((_Base_ptr)VVar50.int_ == local_3b8) {
          local_698.int_._0_4_ =
               (int)((ulong)((long)(this->CompileGroups).
                                   super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->CompileGroups).
                                  super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
          pVar68 = std::
                   _Rb_tree<Json::Value,std::pair<Json::Value_const,unsigned_int>,std::_Select1st<std::pair<Json::Value_const,unsigned_int>>,std::less<Json::Value>,std::allocator<std::pair<Json::Value_const,unsigned_int>>>
                   ::_M_emplace_unique<Json::Value,unsigned_int&>
                             (local_3f8,(Value *)&local_448,(uint *)&local_698.uint_);
          VVar50.int_ = (LargestInt)pVar68.first._M_node;
          local_598.int_ = 0;
          Json::Value::Value((Value *)local_590,arrayValue);
          pVVar55 = (ValueHolder *)
                    (this->CompileGroups).
                    super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_598.int_ = VVar50.int_;
          if (pVVar55 ==
              (ValueHolder *)
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pVVar63 = (ValueHolder *)
                      (this->CompileGroups).
                      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((long)pVVar55 - (long)pVVar63 == 0x7fffffffffffffe0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            lVar41 = (long)pVVar55 - (long)pVVar63 >> 4;
            uVar65 = lVar41 * -0x5555555555555555;
            uVar64 = uVar65;
            if (pVVar55 == pVVar63) {
              uVar64 = 1;
            }
            uVar42 = uVar64 + uVar65;
            if (0x2aaaaaaaaaaaaa9 < uVar42) {
              uVar42 = 0x2aaaaaaaaaaaaaa;
            }
            if (CARRY8(uVar64,uVar65)) {
              uVar42 = 0x2aaaaaaaaaaaaaa;
            }
            if (uVar42 == 0) {
              pCVar45 = (pointer)0x0;
            }
            else {
              pCVar45 = (pointer)operator_new(uVar42 * 0x30);
            }
            pVVar40 = (ValueHolder *)(&pCVar45->Entry + lVar41 * 2);
            pVVar40->int_ = (LargestInt)local_598;
            Json::Value::Value((Value *)(pVVar40 + 1),(Value *)local_590);
            pCVar11 = pCVar45;
            if (pVVar55 != pVVar63) {
              lVar41 = 0;
              local_628 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pVVar40 + 1);
              local_458 = pSVar57;
              do {
                lVar46 = lVar41;
                puVar27 = (undefined8 *)(lVar46 + (long)pVVar63);
                *(undefined8 *)((long)&(pCVar45->Entry)._M_node + lVar46) = *puVar27;
                Json::Value::Value((Value *)((long)&(pCVar45->SourceIndexes).value_ + lVar46),
                                   (Value *)(puVar27 + 1));
                pVVar40 = pVVar63;
                lVar41 = lVar46 + 0x30;
              } while ((ValueHolder *)(puVar27 + 6) != pVVar55);
              do {
                Json::Value::~Value((Value *)(pVVar40 + 1));
                pVVar40 = pVVar40 + 6;
              } while (pVVar40 != pVVar55);
              pSVar57 = local_458;
              pCVar11 = (pointer)((long)&pCVar45[1].Entry._M_node + lVar46);
            }
            if (pVVar63 != (ValueHolder *)0x0) {
              operator_delete(pVVar63,(long)(this->CompileGroups).
                                            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pVVar63);
            }
            (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_start = pCVar45;
            (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish = pCVar11 + 1;
            (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar45 + uVar42;
          }
          else {
            pVVar55->int_ = (LargestInt)VVar50;
            Json::Value::Value((Value *)(pVVar55 + 1),(Value *)local_590);
            ppCVar3 = &(this->CompileGroups).
                       super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppCVar3 = *ppCVar3 + 1;
          }
          Json::Value::~Value((Value *)local_590);
        }
        uVar4 = *(uint *)(VVar50.int_ + 0x48);
        pCVar45 = (this->CompileGroups).
                  super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_598,local_460._0_4_);
        Json::Value::append(&pCVar45[uVar4].SourceIndexes,(Value *)&local_598);
        Json::Value::~Value((Value *)&local_598);
        value = *(UInt *)(VVar50.int_ + 0x48);
        Json::Value::~Value((Value *)&local_448);
        Json::Value::Value((Value *)&local_620,value);
        pVVar21 = Json::Value::operator[](&local_2b0,"compileGroupIndex");
        Json::Value::operator=(pVVar21,(Value *)&local_620);
        Json::Value::~Value((Value *)&local_620);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_allocated_capacity != &local_3d8) {
        operator_delete((void *)local_3e8._M_allocated_capacity,local_3d8._M_allocated_capacity + 1)
        ;
      }
      Json::Value::append(&local_350,&local_2b0);
      Json::Value::~Value(&local_2b0);
      pSVar57 = pSVar57 + 1;
    } while (pSVar57 != local_490);
  }
  pVVar21 = Json::Value::operator[](local_660,"sources");
  Json::Value::operator=(pVVar21,&local_350);
  Json::Value::~Value(&local_350);
  Json::Value::Value((Value *)&local_658,nullValue);
  local_610._M_allocated_capacity._0_4_ = 0x444c4f46;
  local_610._M_local_buf[4] = 'E';
  local_610._M_local_buf[5] = 'R';
  local_618 = (ValueHolder)0x6;
  local_610._M_local_buf[6] = '\0';
  local_620.string_ = (char *)&local_610;
  pcVar22 = cmGeneratorTarget::GetProperty(this->GT,(string *)&local_620);
  if (local_620 != &local_610) {
    operator_delete(local_620.string_,
                    CONCAT17(local_610._M_local_buf[7],
                             CONCAT16(local_610._M_local_buf[6],
                                      CONCAT15(local_610._M_local_buf[5],
                                               CONCAT14(local_610._M_local_buf[4],
                                                        local_610._M_allocated_capacity._0_4_)))) +
                    1);
  }
  if (pcVar22 != (char *)0x0) {
    Json::Value::Value((Value *)&local_620,objectValue);
    Json::Value::operator=((Value *)&local_658,(Value *)&local_620);
    Json::Value::~Value((Value *)&local_620);
    Json::Value::Value((Value *)&local_598,pcVar22);
    pVVar21 = Json::Value::operator[]((Value *)&local_658,"name");
    Json::Value::operator=(pVVar21,(Value *)&local_598);
    Json::Value::~Value((Value *)&local_598);
  }
  bVar16 = Json::Value::isNull((Value *)&local_658);
  if (!bVar16) {
    Json::Value::Value(&local_210,(Value *)&local_658);
    pVVar21 = Json::Value::operator[](local_660,"folder");
    Json::Value::operator=(pVVar21,&local_210);
    Json::Value::~Value(&local_210);
  }
  Json::Value::Value((Value *)local_530,arrayValue);
  pSVar52 = (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar10 = (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar52 != pSVar10) {
    do {
      Json::Value::Value((Value *)&local_698,objectValue);
      Json::Value::Value((Value *)&local_620,&pSVar52->Name);
      pVVar21 = Json::Value::operator[]((Value *)&local_698,"name");
      Json::Value::operator=(pVVar21,(Value *)&local_620);
      Json::Value::~Value((Value *)&local_620);
      Json::Value::Value((Value *)&local_598,&pSVar52->SourceIndexes);
      pVVar21 = Json::Value::operator[]((Value *)&local_698,"sourceIndexes");
      Json::Value::operator=(pVVar21,(Value *)&local_598);
      Json::Value::~Value((Value *)&local_598);
      Json::Value::append((Value *)local_530,(Value *)&local_698);
      Json::Value::~Value((Value *)&local_698);
      pSVar52 = pSVar52 + 1;
    } while (pSVar52 != pSVar10);
  }
  bVar16 = Json::Value::empty((Value *)local_530);
  if (!bVar16) {
    Json::Value::Value(&local_238,(Value *)local_530);
    pVVar21 = Json::Value::operator[](local_660,"sourceGroups");
    Json::Value::operator=(pVVar21,&local_238);
    Json::Value::~Value(&local_238);
  }
  Json::Value::Value((Value *)&local_698,arrayValue);
  pCVar45 = (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar11 = (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar45 != pCVar11) {
    do {
      Json::Value::Value((Value *)&local_598,(Value *)((pCVar45->Entry)._M_node + 1));
      Json::Value::Value((Value *)&local_620,&pCVar45->SourceIndexes);
      pVVar21 = Json::Value::operator[]((Value *)&local_598,"sourceIndexes");
      Json::Value::operator=(pVVar21,(Value *)&local_620);
      Json::Value::~Value((Value *)&local_620);
      Json::Value::append((Value *)&local_698,(Value *)&local_598);
      Json::Value::~Value((Value *)&local_598);
      pCVar45 = pCVar45 + 1;
    } while (pCVar45 != pCVar11);
  }
  bVar16 = Json::Value::empty((Value *)&local_698);
  if (!bVar16) {
    Json::Value::Value(&local_260,(Value *)&local_698);
    pVVar21 = Json::Value::operator[](local_660,"compileGroups");
    Json::Value::operator=(pVVar21,&local_260);
    Json::Value::~Value(&local_260);
  }
  Json::Value::~Value((Value *)&local_698);
  Json::Value::~Value((Value *)local_530);
  Json::Value::~Value((Value *)&local_658);
  Json::Value::Value(&local_3a0,nullValue);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->Backtraces).CommandMap._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->Backtraces).FileMap._M_h);
  std::
  _Hashtable<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->Backtraces).NodeMap._M_h);
  Json::Value::Value((Value *)&local_620,&(this->Backtraces).Commands);
  pVVar21 = Json::Value::operator[](&local_3a0,"commands");
  Json::Value::operator=(pVVar21,(Value *)&local_620);
  Json::Value::~Value((Value *)&local_620);
  Json::Value::Value((Value *)&local_598,&(this->Backtraces).Files);
  pVVar21 = Json::Value::operator[](&local_3a0,"files");
  Json::Value::operator=(pVVar21,(Value *)&local_598);
  Json::Value::~Value((Value *)&local_598);
  Json::Value::Value((Value *)&local_698,&(this->Backtraces).Nodes);
  pVVar21 = Json::Value::operator[](&local_3a0,"nodes");
  Json::Value::operator=(pVVar21,(Value *)&local_698);
  Json::Value::~Value((Value *)&local_698);
  pVVar21 = Json::Value::operator[](local_660,"backtraceGraph");
  Json::Value::operator=(pVVar21,&local_3a0);
  Json::Value::~Value(&local_3a0);
  Json::Value::~Value(&local_328);
  return extraout_RAX;
}

Assistant:

Json::Value Target::Dump()
{
  Json::Value target = Json::objectValue;

  cmStateEnums::TargetType const type = this->GT->GetType();

  target["name"] = this->GT->GetName();
  target["type"] = cmState::GetTargetTypeName(type);
  target["id"] = TargetId(this->GT, this->TopBuild);
  target["paths"] = this->DumpPaths();
  if (this->GT->Target->GetIsGeneratorProvided()) {
    target["isGeneratorProvided"] = true;
  }

  this->AddBacktrace(target, this->GT->GetBacktrace());

  if (this->GT->Target->GetHaveInstallRule()) {
    target["install"] = this->DumpInstall();
  }

  if (this->GT->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = this->DumpArtifacts();
    if (!artifacts.empty()) {
      target["artifacts"] = std::move(artifacts);
    }
  }

  if (type == cmStateEnums::EXECUTABLE ||
      type == cmStateEnums::SHARED_LIBRARY ||
      type == cmStateEnums::MODULE_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["link"] = this->DumpLink();
  } else if (type == cmStateEnums::STATIC_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["archive"] = this->DumpArchive();
  }

  Json::Value dependencies = this->DumpDependencies();
  if (!dependencies.empty()) {
    target["dependencies"] = dependencies;
  }

  {
    this->ProcessLanguages();

    target["sources"] = this->DumpSources();

    Json::Value folder = this->DumpFolder();
    if (!folder.isNull()) {
      target["folder"] = std::move(folder);
    }

    Json::Value sourceGroups = this->DumpSourceGroups();
    if (!sourceGroups.empty()) {
      target["sourceGroups"] = std::move(sourceGroups);
    }

    Json::Value compileGroups = this->DumpCompileGroups();
    if (!compileGroups.empty()) {
      target["compileGroups"] = std::move(compileGroups);
    }
  }

  target["backtraceGraph"] = this->Backtraces.Dump();

  return target;
}